

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_method_postfix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->ss = G->val[-5];
  return;
}

Assistant:

YY_ACTION(void) yy_1_method_postfix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
#define f3 G->val[-2]
#define f2 G->val[-3]
#define k G->val[-4]
#define f1 G->val[-5]
  yyprintf((stderr, "do yy_1_method_postfix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=f1; }\n"));
  yy=f1; ;
#undef a
#undef f3
#undef f2
#undef k
#undef f1
}